

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

int add_to_minv(monst *mon,obj *obj)

{
  int iVar1;
  obj *local_28;
  obj *otmp;
  obj *obj_local;
  monst *mon_local;
  
  otmp = obj;
  obj_local = (obj *)mon;
  if (obj->where != '\0') {
    panic("add_to_minv: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  local_28 = mon->minvent;
  while( true ) {
    if (local_28 == (obj *)0x0) {
      otmp->where = '\x04';
      (otmp->v).v_nexthere = obj_local;
      otmp->nobj = *(obj **)&obj_local->o_id;
      *(obj **)&obj_local->o_id = otmp;
      return 0;
    }
    iVar1 = merged(&local_28,&otmp);
    if (iVar1 != 0) break;
    local_28 = local_28->nobj;
  }
  return 1;
}

Assistant:

int add_to_minv(struct monst *mon, struct obj *obj)
{
    struct obj *otmp;

    if (obj->where != OBJ_FREE) {
	panic("add_to_minv: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    /* merge if possible */
    for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
	if (merged(&otmp, &obj))
	    return 1;	/* obj merged and then free'd */
    /* else insert; don't bother forcing it to end of chain */
    obj->where = OBJ_MINVENT;
    obj->ocarry = mon;
    obj->nobj = mon->minvent;
    mon->minvent = obj;
    return 0;	/* obj on mon's inventory chain */
}